

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_file.c
# Opt level: O0

mpt_metatype * mpt_iterator_filename(char *name)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  FILE *pFVar4;
  mpt_iteratorFile *it;
  int len;
  FILE *file;
  mpt_iteratorFile *data;
  char *name_local;
  
  if (name != (char *)0x0) {
    sVar2 = strlen(name);
    iVar1 = (int)sVar2;
    if (iVar1 != 0) {
      pFVar4 = fopen(name,"r");
      if (pFVar4 == (FILE *)0x0) {
        return (mpt_metatype *)0x0;
      }
      it = (mpt_iteratorFile *)malloc((long)iVar1 + 0x61);
      if (it == (mpt_iteratorFile *)0x0) {
        return (mpt_metatype *)0x0;
      }
      fileInit(it);
      it->fd = (FILE *)pFVar4;
      memcpy(it + 1,name,(long)(iVar1 + 1));
      it->name = (char *)(it + 1);
      return &it->_mt;
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return (mpt_metatype *)0x0;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_filename(const char *name)
{
	MPT_STRUCT(iteratorFile) *data;
	FILE *file;
	int len;
	
	if (!name || !(len = strlen(name))) {
		errno = EINVAL;
		return 0;
	}
	if (!(file = fopen(name, "r"))) {
		return 0;
	}
	if (!(data = malloc(sizeof(*data) + len + 1))) {
		return 0;
	}
	fileInit(data);
	data->fd = file;
	data->name = memcpy(data + 1, name, len + 1);
	
	return &data->_mt;
}